

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O1

void __thiscall
prometheus::anon_unknown_0::BasicAuthIntegrationTest::~BasicAuthIntegrationTest
          (BasicAuthIntegrationTest *this)

{
  function<void_(void_*)> *pfVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar2;
  _Manager_type p_Var3;
  
  (this->super_IntegrationTest).super_Test._vptr_Test =
       (_func_int **)&PTR__BasicAuthIntegrationTest_00190210;
  this_00 = (this->registry_).super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pcVar2 = (this->password_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->password_).field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->username_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->username_).field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->counter_name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->counter_name_).field_2) {
    operator_delete(pcVar2);
  }
  (this->super_IntegrationTest).super_Test._vptr_Test = (_func_int **)&PTR__IntegrationTest_0018fd80
  ;
  pcVar2 = (this->super_IntegrationTest).default_metrics_path_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->super_IntegrationTest).default_metrics_path_.field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->super_IntegrationTest).base_url_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->super_IntegrationTest).base_url_.field_2) {
    operator_delete(pcVar2);
  }
  std::unique_ptr<prometheus::Exposer,_std::default_delete<prometheus::Exposer>_>::~unique_ptr
            (&(this->super_IntegrationTest).exposer_);
  p_Var3 = (this->super_IntegrationTest).fetchPrePerform_.super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    pfVar1 = &(this->super_IntegrationTest).fetchPrePerform_;
    (*p_Var3)((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  testing::Test::~Test((Test *)this);
  return;
}

Assistant:

void SetUp() override {
    IntegrationTest::SetUp();

    registry_ = RegisterSomeCounter(counter_name_, default_metrics_path_);

    exposer_->RegisterAuth(
        [&](const std::string& user, const std::string& password) {
          return user == username_ && password == password_;
        },
        "Some Auth Realm", default_metrics_path_);
  }